

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<56>,Blob<160>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  Blob<160> B;
  Blob<160> A;
  Blob<56> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_78;
  uint32_t local_74;
  int *in_stack_ffffffffffffff90;
  int iVar3;
  undefined4 in_stack_ffffffffffffff9c;
  Rand *in_stack_ffffffffffffffa0;
  Blob<160> local_4f;
  Blob<56> local_3b;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 7;
  local_2c = 0x14;
  local_30 = 0x38;
  local_34 = 0xa0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<56>::Blob(&local_3b);
  Blob<160>::Blob(&local_4f);
  Blob<160>::Blob((Blob<160> *)&stack0xffffffffffffff9d);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffffa0,(void *)CONCAT44(in_stack_ffffffffffffff9c,iVar3),
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    (*local_8)(&local_3b,7,0,&local_4f);
    in_stack_ffffffffffffff90 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (local_74 = 0; (int)local_74 < 0x38; local_74 = local_74 + 1) {
      flipbit(&local_3b,7,local_74);
      (*local_8)(&local_3b,7,0,&stack0xffffffffffffff9d);
      flipbit(&local_3b,7,local_74);
      for (local_78 = 0; (int)local_78 < 0xa0; local_78 = local_78 + 1) {
        uVar1 = getbit(&local_4f,0x14,local_78);
        uVar2 = getbit(&stack0xffffffffffffff9d,0x14,local_78);
        *in_stack_ffffffffffffff90 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff90;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}